

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraInd.c
# Opt level: O0

Aig_Man_t * Fra_FraigInduction(Aig_Man_t *pManAig,Fra_Ssw_t *pParams)

{
  float fVar1;
  undefined8 p_00;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  abctime aVar8;
  Fra_Sml_t *pFVar9;
  Vec_Int_t *pVVar10;
  abctime aVar11;
  abctime aVar12;
  Aig_Man_t *pAVar13;
  abctime aVar14;
  void *pvVar15;
  Aig_Obj_t *pObj_00;
  char *pFileName_00;
  int local_184;
  int local_17c;
  int local_134;
  int local_130;
  float local_11c;
  char *pFileName;
  Aig_Man_t *pNew;
  abctime clk3;
  int nHotsOld;
  int nImpsOld;
  int nLitsOld;
  abctime TimeToStop;
  abctime clk2;
  abctime clk;
  int i;
  int nIter;
  int nRegsBeg;
  int nNodesBeg;
  Aig_Man_t *pManAigNew;
  Cnf_Dat_t *pCnf;
  Aig_Obj_t *pObj;
  Fra_Par_t *pPars;
  Fra_Par_t Pars;
  Fra_Man_t *p;
  int fUseOldSimulation;
  int fUseSimpleCnf;
  Fra_Ssw_t *pParams_local;
  Aig_Man_t *pManAig_local;
  
  _nRegsBeg = (Aig_Man_t *)0x0;
  clk._4_4_ = 0xffffffff;
  aVar8 = Abc_Clock();
  if ((pParams->TimeLimit != 0.0) || (NAN(pParams->TimeLimit))) {
    fVar1 = pParams->TimeLimit;
    aVar11 = Abc_Clock();
    local_11c = fVar1 * 1e+06 + (float)aVar11;
  }
  else {
    local_11c = 0.0;
  }
  iVar2 = Aig_ManNodeNum(pManAig);
  if (iVar2 == 0) {
    pParams->nIters = 0;
    iVar2 = Aig_ManObjNumMax(pManAig);
    Aig_ManReprStart(pManAig,iVar2);
    pManAig_local = Aig_ManDupOrdered(pManAig);
  }
  else {
    iVar2 = Aig_ManRegNum(pManAig);
    if (iVar2 < 1) {
      __assert_fail("Aig_ManRegNum(pManAig) > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraInd.c"
                    ,0x174,"Aig_Man_t *Fra_FraigInduction(Aig_Man_t *, Fra_Ssw_t *)");
    }
    if (pParams->nFramesK < 1) {
      __assert_fail("pParams->nFramesK > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraInd.c"
                    ,0x175,"Aig_Man_t *Fra_FraigInduction(Aig_Man_t *, Fra_Ssw_t *)");
    }
    if ((pParams->fWriteImps != 0) && (0 < pParams->nPartSize)) {
      pParams->nPartSize = 0;
      printf("Partitioning was disabled to allow implication writing.\n");
    }
    if (((pParams->nPartSize < 1) ||
        (iVar2 = pParams->nPartSize, iVar3 = Aig_ManRegNum(pManAig), iVar3 <= iVar2)) &&
       ((pManAig->vClockDoms == (Vec_Vec_t *)0x0 ||
        (iVar2 = Vec_VecSize(pManAig->vClockDoms), iVar2 < 1)))) {
      iVar2 = Aig_ManNodeNum(pManAig);
      iVar3 = Aig_ManRegNum(pManAig);
      Fra_ParamsDefaultSeq((Fra_Par_t *)&pPars);
      Pars.nBTLimitMiter = pParams->nFramesP;
      Pars.nLevelMax = pParams->nFramesK;
      Pars.nFramesP = pParams->nMaxImps;
      Pars.nFramesK = pParams->nMaxLevs;
      Pars.fSpeculate = pParams->fVerbose;
      Pars.nMaxImps = pParams->fRewrite;
      Pars.nMaxLevs = pParams->fLatchCorr;
      Pars.fRewrite = pParams->fUseImps;
      Pars.fUseImps = pParams->fWriteImps;
      Pars.fLatchCorr = pParams->fUse1Hot;
      if ((0 < Pars.nBTLimitMiter) && (Pars.fLatchCorr != 0)) {
        __assert_fail("!(pPars->nFramesP > 0 && pPars->fUse1Hot)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraInd.c"
                      ,0x195,"Aig_Man_t *Fra_FraigInduction(Aig_Man_t *, Fra_Ssw_t *)");
      }
      if ((1 < Pars.nLevelMax) && (Pars.fLatchCorr != 0)) {
        __assert_fail("!(pPars->nFramesK > 1 && pPars->fUse1Hot)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraInd.c"
                      ,0x196,"Aig_Man_t *Fra_FraigInduction(Aig_Man_t *, Fra_Ssw_t *)");
      }
      Pars._112_8_ = Fra_ManStart(pManAig,(Fra_Par_t *)&pPars);
      ((Fra_Man_t *)Pars._112_8_)->pPars->nBTLimitNode = 0;
      if (Pars.fSpeculate != 0) {
        uVar5 = Aig_ManNodeNum(pManAig);
        printf("Simulating %d AIG nodes for %d cycles ... ",(ulong)uVar5,
               (ulong)(Pars.nBTLimitMiter + 0x20));
      }
      pFVar9 = Fra_SmlSimulateSeq(pManAig,Pars.nBTLimitMiter,0x20,1,1);
      *(Fra_Sml_t **)(Pars._112_8_ + 0x38) = pFVar9;
      if (Pars.fSpeculate != 0) {
        Abc_Print(1,"%s =","Time");
        aVar11 = Abc_Clock();
        Abc_Print(1,"%9.2f sec\n",((double)(aVar11 - aVar8) * 1.0) / 1000000.0);
      }
      Fra_ClassesPrepare(*(Fra_Cla_t **)(Pars._112_8_ + 0x30),*(int *)(*(long *)Pars._112_8_ + 0x60)
                         ,*(int *)(*(long *)Pars._112_8_ + 0x58));
      if (*(int *)(*(long *)Pars._112_8_ + 0x68) != 0) {
        pVVar10 = Fra_OneHotCompute((Fra_Man_t *)Pars._112_8_,*(Fra_Sml_t **)(Pars._112_8_ + 0x38));
        *(Vec_Int_t **)(Pars._112_8_ + 0x60) = pVVar10;
      }
      Fra_SmlStop(*(Fra_Sml_t **)(Pars._112_8_ + 0x38));
      pFVar9 = Fra_SmlStart(pManAig,0,Pars.nLevelMax + 1,(int)pPars);
      *(Fra_Sml_t **)(Pars._112_8_ + 0x38) = pFVar9;
      if (Pars.fRewrite != 0) {
        pVVar10 = Fra_ImpDerive((Fra_Man_t *)Pars._112_8_,5000000,Pars.nFramesP,Pars.nMaxLevs);
        *(Vec_Int_t **)(*(long *)(Pars._112_8_ + 0x30) + 0x50) = pVVar10;
      }
      if (((pParams->TimeLimit == 0.0) && (!NAN(pParams->TimeLimit))) ||
         (aVar11 = Abc_Clock(), aVar11 <= (long)local_11c)) {
        Fra_BmcPerform((Fra_Man_t *)Pars._112_8_,Pars.nBTLimitMiter,Pars.nLevelMax + 1);
        iVar4 = Fra_ClassesCountLits(*(Fra_Cla_t **)(Pars._112_8_ + 0x30));
        *(int *)(Pars._112_8_ + 0xb8) = iVar4;
        *(int *)(Pars._112_8_ + 0xc0) = iVar2;
        *(int *)(Pars._112_8_ + 200) = iVar3;
        *(undefined4 *)(*(long *)(Pars._112_8_ + 0x30) + 0x4c) = 1;
        clk._4_4_ = 0;
        while (*(int *)(*(long *)(Pars._112_8_ + 0x30) + 0x4c) != 0) {
          iVar2 = Fra_ClassesCountLits(*(Fra_Cla_t **)(Pars._112_8_ + 0x30));
          if (*(long *)(*(long *)(Pars._112_8_ + 0x30) + 0x50) == 0) {
            local_130 = 0;
          }
          else {
            local_130 = Vec_IntSize(*(Vec_Int_t **)(*(long *)(Pars._112_8_ + 0x30) + 0x50));
          }
          if (*(long *)(Pars._112_8_ + 0x60) == 0) {
            local_134 = 0;
          }
          else {
            local_134 = Fra_OneHotCount((Fra_Man_t *)Pars._112_8_,
                                        *(Vec_Int_t **)(Pars._112_8_ + 0x60));
          }
          aVar11 = Abc_Clock();
          if (((pParams->TimeLimit != 0.0) || (NAN(pParams->TimeLimit))) &&
             (aVar12 = Abc_Clock(), (long)local_11c < aVar12)) {
            if (pParams->fSilent == 0) {
              printf("Fra_FraigInduction(): Runtime limit exceeded.\n");
            }
            goto LAB_007e223e;
          }
          *(undefined4 *)(*(long *)(Pars._112_8_ + 0x30) + 0x4c) = 0;
          aVar12 = Abc_Clock();
          pAVar13 = Fra_FramesWithClasses((Fra_Man_t *)Pars._112_8_);
          *(Aig_Man_t **)(Pars._112_8_ + 0x10) = pAVar13;
          aVar14 = Abc_Clock();
          *(abctime *)(Pars._112_8_ + 0x108) = (aVar14 - aVar12) + *(long *)(Pars._112_8_ + 0x108);
          if (*(int *)(*(long *)Pars._112_8_ + 0x5c) != 0) {
            Fra_FraigInductionRewrite((Fra_Man_t *)Pars._112_8_);
          }
          if (Pars.fRewrite == 0) {
            pAVar13 = *(Aig_Man_t **)(Pars._112_8_ + 0x10);
            iVar3 = Aig_ManRegNum(*(Aig_Man_t **)(Pars._112_8_ + 0x10));
            pManAigNew = (Aig_Man_t *)Cnf_Derive(pAVar13,iVar3);
          }
          else {
            pAVar13 = *(Aig_Man_t **)(Pars._112_8_ + 0x10);
            iVar3 = Aig_ManRegNum(*(Aig_Man_t **)(Pars._112_8_ + 0x10));
            pManAigNew = (Aig_Man_t *)Cnf_DeriveSimple(pAVar13,iVar3);
          }
          pvVar15 = Cnf_DataWriteIntoSolver((Cnf_Dat_t *)pManAigNew,1,0);
          *(void **)(Pars._112_8_ + 0x68) = pvVar15;
          *(undefined4 *)(Pars._112_8_ + 0x70) = *(undefined4 *)&pManAigNew->pSpec;
          if (*(long *)(Pars._112_8_ + 0x68) == 0) {
            __assert_fail("p->pSat != NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraInd.c"
                          ,0x1fd,"Aig_Man_t *Fra_FraigInduction(Aig_Man_t *, Fra_Ssw_t *)");
          }
          if (*(long *)(Pars._112_8_ + 0x68) == 0) {
            printf("Fra_FraigInduction(): Computed CNF is not valid.\n");
          }
          if ((Pars.fRewrite != 0) &&
             (Fra_ImpAddToSolver((Fra_Man_t *)Pars._112_8_,
                                 *(Vec_Int_t **)(*(long *)(Pars._112_8_ + 0x30) + 0x50),
                                 &pManAigNew->vObjs->nCap), *(long *)(Pars._112_8_ + 0x68) == 0)) {
            printf("Fra_FraigInduction(): Adding implicationsn to CNF led to a conflict.\n");
          }
          for (clk._0_4_ = 0;
              iVar3 = Vec_PtrSize(*(Vec_Ptr_t **)(*(long *)(Pars._112_8_ + 0x10) + 0x20)),
              p_00 = Pars._112_8_, (int)clk < iVar3; clk._0_4_ = (int)clk + 1) {
            pvVar15 = Vec_PtrEntry(*(Vec_Ptr_t **)(*(long *)(Pars._112_8_ + 0x10) + 0x20),(int)clk);
            if (pvVar15 != (void *)0x0) {
              *(undefined8 *)((long)pvVar15 + 0x28) = Pars._112_8_;
            }
          }
          iVar3 = Aig_ManObjNumMax(*(Aig_Man_t **)(Pars._112_8_ + 0x10));
          iVar4 = Aig_ManNodeNum(*(Aig_Man_t **)(Pars._112_8_ + 8));
          Fra_ManClean((Fra_Man_t *)p_00,iVar3 + iVar4);
          for (clk._0_4_ = 0;
              iVar3 = Vec_PtrSize(*(Vec_Ptr_t **)(*(long *)(Pars._112_8_ + 0x10) + 0x20)),
              (int)clk < iVar3; clk._0_4_ = (int)clk + 1) {
            pObj_00 = (Aig_Obj_t *)
                      Vec_PtrEntry(*(Vec_Ptr_t **)(*(long *)(Pars._112_8_ + 0x10) + 0x20),(int)clk);
            if ((pObj_00 != (Aig_Obj_t *)0x0) && ((&pManAigNew->vObjs->nCap)[pObj_00->Id] != -1)) {
              Fra_ObjSetSatNum(pObj_00,(&pManAigNew->vObjs->nCap)[pObj_00->Id]);
              Fra_ObjSetFaninVec(pObj_00,(Vec_Ptr_t *)0x1);
            }
          }
          Cnf_DataFree((Cnf_Dat_t *)pManAigNew);
          if (*(int *)(*(long *)Pars._112_8_ + 0x68) != 0) {
            Fra_OneHotAssume((Fra_Man_t *)Pars._112_8_,*(Vec_Int_t **)(Pars._112_8_ + 0x60));
          }
          if (Pars.fSpeculate != 0) {
            uVar5 = Vec_PtrSize(*(Vec_Ptr_t **)(*(long *)(Pars._112_8_ + 0x30) + 0x18));
            uVar6 = Vec_PtrSize(*(Vec_Ptr_t **)(*(long *)(Pars._112_8_ + 0x30) + 0x10));
            uVar7 = Fra_ClassesCountLits(*(Fra_Cla_t **)(Pars._112_8_ + 0x30));
            printf("%3d : C = %6d. Cl = %6d.  L = %6d. LR = %6d.  ",(ulong)clk._4_4_,(ulong)uVar5,
                   (ulong)uVar6,(ulong)uVar7,(ulong)*(uint *)(*(long *)(Pars._112_8_ + 0x10) + 0x74)
                  );
            if (*(long *)(*(long *)(Pars._112_8_ + 0x30) + 0x50) != 0) {
              uVar5 = Vec_IntSize(*(Vec_Int_t **)(*(long *)(Pars._112_8_ + 0x30) + 0x50));
              printf("I = %6d. ",(ulong)uVar5);
            }
            if (*(int *)(*(long *)Pars._112_8_ + 0x68) != 0) {
              uVar5 = Fra_OneHotCount((Fra_Man_t *)Pars._112_8_,*(Vec_Int_t **)(Pars._112_8_ + 0x60)
                                     );
              printf("1h = %6d. ",(ulong)uVar5);
            }
            Aig_ManNodeNum(*(Aig_Man_t **)(Pars._112_8_ + 0x10));
            printf("NR = %6d. ");
          }
          *(undefined4 *)(Pars._112_8_ + 0xf4) = 0;
          *(undefined4 *)(Pars._112_8_ + 0xf8) = 0;
          Abc_Clock();
          if (*(int *)(*(long *)Pars._112_8_ + 0x68) != 0) {
            Fra_OneHotCheck((Fra_Man_t *)Pars._112_8_,*(Vec_Int_t **)(Pars._112_8_ + 0x60));
          }
          Fra_FraigSweep((Fra_Man_t *)Pars._112_8_);
          if (Pars.fSpeculate != 0) {
            Abc_Print(1,"%s =","T");
            aVar12 = Abc_Clock();
            Abc_Print(1,"%9.2f sec\n",((double)(aVar12 - aVar11) * 1.0) / 1000000.0);
          }
          Aig_ManStop(*(Aig_Man_t **)(Pars._112_8_ + 0x10));
          *(undefined8 *)(Pars._112_8_ + 0x10) = 0;
          sat_solver_delete(*(sat_solver **)(Pars._112_8_ + 0x68));
          *(undefined8 *)(Pars._112_8_ + 0x68) = 0;
          memset(*(void **)(Pars._112_8_ + 0x20),0,
                 (long)*(int *)(Pars._112_8_ + 0x28) * 8 * (long)*(int *)(Pars._112_8_ + 0x18));
          if (*(long *)(Pars._112_8_ + 0xa8) != 0) {
            __assert_fail("p->vTimeouts == NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraInd.c"
                          ,0x23f,"Aig_Man_t *Fra_FraigInduction(Aig_Man_t *, Fra_Ssw_t *)");
          }
          if (*(long *)(Pars._112_8_ + 0xa8) != 0) {
            printf("Fra_FraigInduction(): SAT solver timed out!\n");
          }
          if ((*(int *)(*(long *)(Pars._112_8_ + 0x30) + 0x4c) != 0) &&
             (iVar3 = Fra_ClassesCountLits(*(Fra_Cla_t **)(Pars._112_8_ + 0x30)), iVar2 == iVar3)) {
            if (*(long *)(*(long *)(Pars._112_8_ + 0x30) + 0x50) == 0) {
              local_17c = 0;
            }
            else {
              local_17c = Vec_IntSize(*(Vec_Int_t **)(*(long *)(Pars._112_8_ + 0x30) + 0x50));
            }
            if (local_130 == local_17c) {
              if (*(long *)(Pars._112_8_ + 0x60) == 0) {
                local_184 = 0;
              }
              else {
                local_184 = Fra_OneHotCount((Fra_Man_t *)Pars._112_8_,
                                            *(Vec_Int_t **)(Pars._112_8_ + 0x60));
              }
              if (local_134 == local_184) {
                printf("Fra_FraigInduction(): Internal error. The result may not verify.\n");
                break;
              }
            }
          }
          clk._4_4_ = clk._4_4_ + 1;
        }
        aVar11 = Abc_Clock();
        if (((*(int *)(*(long *)Pars._112_8_ + 0x6c) == 0) || (*(long *)(Pars._112_8_ + 0x60) == 0))
           || (iVar2 = Fra_OneHotCount((Fra_Man_t *)Pars._112_8_,
                                       *(Vec_Int_t **)(Pars._112_8_ + 0x60)), iVar2 == 0)) {
          Fra_ClassesSelectRepr(*(Fra_Cla_t **)(Pars._112_8_ + 0x30));
          Fra_ClassesCopyReprs
                    (*(Fra_Cla_t **)(Pars._112_8_ + 0x30),*(Vec_Ptr_t **)(Pars._112_8_ + 0xa8));
          _nRegsBeg = Aig_ManDupRepr(pManAig,0);
        }
        else {
          pFileName_00 = Ioa_FileNameGenericAppend
                                   ((char *)**(undefined8 **)(Pars._112_8_ + 8),"_care.aig");
          printf("Care one-hotness clauses will be written into file \"%s\".\n",pFileName_00);
          _nRegsBeg = Aig_ManDupOrdered(pManAig);
          pAVar13 = Fra_OneHotCreateExdc
                              ((Fra_Man_t *)Pars._112_8_,*(Vec_Int_t **)(Pars._112_8_ + 0x60));
          Ioa_WriteAiger(pAVar13,pFileName_00,0,1);
          Aig_ManStop(pAVar13);
        }
        Aig_ManSeqCleanup(_nRegsBeg);
        aVar12 = Abc_Clock();
        *(abctime *)(Pars._112_8_ + 0x108) = (aVar12 - aVar11) + *(long *)(Pars._112_8_ + 0x108);
        aVar11 = Abc_Clock();
        *(abctime *)(Pars._112_8_ + 0x140) = aVar11 - aVar8;
        iVar2 = Fra_ClassesCountLits(*(Fra_Cla_t **)(Pars._112_8_ + 0x30));
        *(int *)(Pars._112_8_ + 0xbc) = iVar2;
        iVar2 = Aig_ManNodeNum(_nRegsBeg);
        *(int *)(Pars._112_8_ + 0xc4) = iVar2;
        iVar2 = Aig_ManRegNum(_nRegsBeg);
        *(int *)(Pars._112_8_ + 0xcc) = iVar2;
      }
      else if (pParams->fSilent == 0) {
        printf("Fra_FraigInduction(): Runtime limit exceeded.\n");
      }
LAB_007e223e:
      Fra_ManStop((Fra_Man_t *)Pars._112_8_);
      pParams->nIters = clk._4_4_;
      pManAig_local = _nRegsBeg;
    }
    else {
      pManAig_local = Fra_FraigInductionPart(pManAig,pParams);
    }
  }
  return pManAig_local;
}

Assistant:

Aig_Man_t * Fra_FraigInduction( Aig_Man_t * pManAig, Fra_Ssw_t * pParams )
{
    int fUseSimpleCnf = 0;
    int fUseOldSimulation = 0;
    // other paramaters affecting performance
    // - presence of FRAIGing in Abc_NtkDarSeqSweep()
    // - using distance-1 patterns in Fra_SmlAssignDist1()
    // - the number of simulation patterns
    // - the number of BMC frames

    Fra_Man_t * p;
    Fra_Par_t Pars, * pPars = &Pars; 
    Aig_Obj_t * pObj;
    Cnf_Dat_t * pCnf;
    Aig_Man_t * pManAigNew = NULL;
    int nNodesBeg, nRegsBeg;
    int nIter = -1; // Suppress "might be used uninitialized"
    int i;
    abctime clk = Abc_Clock(), clk2;
    abctime TimeToStop = pParams->TimeLimit ? pParams->TimeLimit * CLOCKS_PER_SEC + Abc_Clock() : 0;

    if ( Aig_ManNodeNum(pManAig) == 0 )
    {
        pParams->nIters = 0;
        // Ntl_ManFinalize() needs the following to satisfy an assertion
        Aig_ManReprStart(pManAig,Aig_ManObjNumMax(pManAig));
        return Aig_ManDupOrdered(pManAig);
    }
    assert( Aig_ManRegNum(pManAig) > 0 );
    assert( pParams->nFramesK > 0 );
//Aig_ManShow( pManAig, 0, NULL );

    if ( pParams->fWriteImps && pParams->nPartSize > 0 )
    {
        pParams->nPartSize = 0;
        printf( "Partitioning was disabled to allow implication writing.\n" );
    }
    // perform partitioning
    if ( (pParams->nPartSize > 0 && pParams->nPartSize < Aig_ManRegNum(pManAig))
         || (pManAig->vClockDoms && Vec_VecSize(pManAig->vClockDoms) > 0)  )
        return Fra_FraigInductionPart( pManAig, pParams );
 
    nNodesBeg = Aig_ManNodeNum(pManAig);
    nRegsBeg  = Aig_ManRegNum(pManAig);

    // enhance the AIG by adding timeframes
//    Fra_FramesAddMore( pManAig, 3 );

    // get parameters
    Fra_ParamsDefaultSeq( pPars );
    pPars->nFramesP   = pParams->nFramesP;
    pPars->nFramesK   = pParams->nFramesK;
    pPars->nMaxImps   = pParams->nMaxImps;
    pPars->nMaxLevs   = pParams->nMaxLevs;
    pPars->fVerbose   = pParams->fVerbose;
    pPars->fRewrite   = pParams->fRewrite;
    pPars->fLatchCorr = pParams->fLatchCorr;
    pPars->fUseImps   = pParams->fUseImps;
    pPars->fWriteImps = pParams->fWriteImps;
    pPars->fUse1Hot   = pParams->fUse1Hot;

    assert( !(pPars->nFramesP > 0 && pPars->fUse1Hot) );
    assert( !(pPars->nFramesK > 1 && pPars->fUse1Hot) );
 
    // start the fraig manager for this run
    p = Fra_ManStart( pManAig, pPars );
    p->pPars->nBTLimitNode = 0;
    // derive and refine e-classes using K initialized frames
    if ( fUseOldSimulation )
    {
        if ( pPars->nFramesP > 0 )
        {
            pPars->nFramesP = 0;
            printf( "Fra_FraigInduction(): Prefix cannot be used.\n" );
        }
        p->pSml = Fra_SmlStart( pManAig, 0, pPars->nFramesK + 1, pPars->nSimWords );
        Fra_SmlSimulate( p, 1 );
    }
    else
    {
        // bug:  r iscas/blif/s5378.blif    ; st; ssw -v
        // bug:  r iscas/blif/s1238.blif    ; st; ssw -v
        // refine the classes with more simulation rounds
if ( pPars->fVerbose )
printf( "Simulating %d AIG nodes for %d cycles ... ", Aig_ManNodeNum(pManAig), pPars->nFramesP + 32 );
        p->pSml = Fra_SmlSimulateSeq( pManAig, pPars->nFramesP, 32, 1, 1  ); //pPars->nFramesK + 1, 1 );  
if ( pPars->fVerbose ) 
{
ABC_PRT( "Time", Abc_Clock() - clk );
}
        Fra_ClassesPrepare( p->pCla, p->pPars->fLatchCorr, p->pPars->nMaxLevs );
//        Fra_ClassesPostprocess( p->pCla );
        // compute one-hotness conditions
        if ( p->pPars->fUse1Hot )
            p->vOneHots = Fra_OneHotCompute( p, p->pSml );
        // allocate new simulation manager for simulating counter-examples
        Fra_SmlStop( p->pSml );
        p->pSml = Fra_SmlStart( pManAig, 0, pPars->nFramesK + 1, pPars->nSimWords );
    }

    // select the most expressive implications
    if ( pPars->fUseImps )
        p->pCla->vImps = Fra_ImpDerive( p, 5000000, pPars->nMaxImps, pPars->fLatchCorr );

    if ( pParams->TimeLimit != 0.0 && Abc_Clock() > TimeToStop )
    {
        if ( !pParams->fSilent )
            printf( "Fra_FraigInduction(): Runtime limit exceeded.\n" );
        goto finish;
    }

    // perform BMC (for the min number of frames)
    Fra_BmcPerform( p, pPars->nFramesP, pPars->nFramesK+1 ); // +1 is needed to prevent non-refinement
//Fra_ClassesPrint( p->pCla, 1 );
//    if ( p->vCex == NULL )
//        p->vCex = Vec_IntAlloc( 1000 );

    p->nLitsBeg  = Fra_ClassesCountLits( p->pCla );
    p->nNodesBeg = nNodesBeg; // Aig_ManNodeNum(pManAig);
    p->nRegsBeg  = nRegsBeg; // Aig_ManRegNum(pManAig);

    // dump AIG of the timeframes
//    pManAigNew = Fra_ClassesDeriveAig( p->pCla, pPars->nFramesK );
//    Aig_ManDumpBlif( pManAigNew, "frame_aig.blif", NULL, NULL );
//    Fra_ManPartitionTest2( pManAigNew );
//    Aig_ManStop( pManAigNew );
 
    // iterate the inductive case
    p->pCla->fRefinement = 1;
    for ( nIter = 0; p->pCla->fRefinement; nIter++ )
    {
        int nLitsOld = Fra_ClassesCountLits(p->pCla);
        int nImpsOld = p->pCla->vImps? Vec_IntSize(p->pCla->vImps) : 0;
        int nHotsOld = p->vOneHots? Fra_OneHotCount(p, p->vOneHots) : 0;
        abctime clk3 = Abc_Clock();

        if ( pParams->TimeLimit != 0.0 && Abc_Clock() > TimeToStop )
        {
            if ( !pParams->fSilent )
                printf( "Fra_FraigInduction(): Runtime limit exceeded.\n" );
            goto finish;
        }

        // mark the classes as non-refined
        p->pCla->fRefinement = 0;
        // derive non-init K-timeframes while implementing e-classes
clk2 = Abc_Clock();
        p->pManFraig = Fra_FramesWithClasses( p );
p->timeTrav += Abc_Clock() - clk2;
//Aig_ManDumpBlif( p->pManFraig, "testaig.blif", NULL, NULL );

        // perform AIG rewriting
        if ( p->pPars->fRewrite )
            Fra_FraigInductionRewrite( p );

        // convert the manager to SAT solver (the last nLatches outputs are inputs)
        if ( fUseSimpleCnf || pPars->fUseImps )
            pCnf = Cnf_DeriveSimple( p->pManFraig, Aig_ManRegNum(p->pManFraig) );
        else
            pCnf = Cnf_Derive( p->pManFraig, Aig_ManRegNum(p->pManFraig) );
//        Cnf_DataTranformPolarity( pCnf, 0 );
//Cnf_DataWriteIntoFile( pCnf, "temp.cnf", 1 );

        p->pSat = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, 1, 0 );
        p->nSatVars = pCnf->nVars;
        assert( p->pSat != NULL );
        if ( p->pSat == NULL )
            printf( "Fra_FraigInduction(): Computed CNF is not valid.\n" );
        if ( pPars->fUseImps )
        {
            Fra_ImpAddToSolver( p, p->pCla->vImps, pCnf->pVarNums );
            if ( p->pSat == NULL )
                printf( "Fra_FraigInduction(): Adding implicationsn to CNF led to a conflict.\n" );
        }

        // set the pointers to the manager
        Aig_ManForEachObj( p->pManFraig, pObj, i )
            pObj->pData = p;

        // prepare solver for fraiging the last timeframe
        Fra_ManClean( p, Aig_ManObjNumMax(p->pManFraig) + Aig_ManNodeNum(p->pManAig) );

        // transfer PI/LO variable numbers
        Aig_ManForEachObj( p->pManFraig, pObj, i )
        {
            if ( pCnf->pVarNums[pObj->Id] == -1 )
                continue;
            Fra_ObjSetSatNum( pObj, pCnf->pVarNums[pObj->Id] );
            Fra_ObjSetFaninVec( pObj, (Vec_Ptr_t *)1 );
        }
        Cnf_DataFree( pCnf );

        // add one-hotness clauses
        if ( p->pPars->fUse1Hot )
            Fra_OneHotAssume( p, p->vOneHots );
//        if ( p->pManAig->vOnehots )
//            Fra_OneHotAddKnownConstraint( p, p->pManAig->vOnehots );
 
        // report the intermediate results
        if ( pPars->fVerbose )
        {
            printf( "%3d : C = %6d. Cl = %6d.  L = %6d. LR = %6d.  ", 
                nIter, Vec_PtrSize(p->pCla->vClasses1), Vec_PtrSize(p->pCla->vClasses), 
                Fra_ClassesCountLits(p->pCla), p->pManFraig->nAsserts );
            if ( p->pCla->vImps )
                printf( "I = %6d. ", Vec_IntSize(p->pCla->vImps) );
            if ( p->pPars->fUse1Hot )
                printf( "1h = %6d. ", Fra_OneHotCount(p, p->vOneHots) );
            printf( "NR = %6d. ", Aig_ManNodeNum(p->pManFraig) );
//            printf( "\n" );
        } 

        // perform sweeping
        p->nSatCallsRecent = 0;
        p->nSatCallsSkipped = 0;
clk2 = Abc_Clock();
        if ( p->pPars->fUse1Hot )
            Fra_OneHotCheck( p, p->vOneHots );
        Fra_FraigSweep( p );
        if ( pPars->fVerbose )
        {
            ABC_PRT( "T", Abc_Clock() - clk3 );
        } 

//        Sat_SolverPrintStats( stdout, p->pSat );
        // remove FRAIG and SAT solver
        Aig_ManStop( p->pManFraig );   p->pManFraig = NULL;
//        printf( "Vars = %d. Clauses = %d. Learnts = %d.\n", p->pSat->size, p->pSat->clauses.size, p->pSat->learnts.size );
        sat_solver_delete( p->pSat );  p->pSat = NULL; 
        memset( p->pMemFraig, 0, sizeof(Aig_Obj_t *) * p->nSizeAlloc * p->nFramesAll );
//        printf( "Recent SAT called = %d. Skipped = %d.\n", p->nSatCallsRecent, p->nSatCallsSkipped );
        assert( p->vTimeouts == NULL );
        if ( p->vTimeouts )
           printf( "Fra_FraigInduction(): SAT solver timed out!\n" );
        // check if refinement has happened
//        p->pCla->fRefinement = (int)(nLitsOld != Fra_ClassesCountLits(p->pCla));
        if ( p->pCla->fRefinement && 
            nLitsOld == Fra_ClassesCountLits(p->pCla) && 
            nImpsOld == (p->pCla->vImps? Vec_IntSize(p->pCla->vImps) : 0) && 
            nHotsOld == (p->vOneHots? Fra_OneHotCount(p, p->vOneHots) : 0) )
        {
            printf( "Fra_FraigInduction(): Internal error. The result may not verify.\n" );
            break;
        }
    }
/*
    // verify implications using simulation
    if ( p->pCla->vImps && Vec_IntSize(p->pCla->vImps) )
    {
        int Temp;
        abctime clk = Abc_Clock();
        if ( Temp = Fra_ImpVerifyUsingSimulation( p ) )
            printf( "Implications failing the simulation test = %d (out of %d).  ", Temp, Vec_IntSize(p->pCla->vImps) );
        else
            printf( "All %d implications have passed the simulation test.  ", Vec_IntSize(p->pCla->vImps) );
        ABC_PRT( "Time", Abc_Clock() - clk );
    }
*/

    // move the classes into representatives and reduce AIG
clk2 = Abc_Clock();
    if ( p->pPars->fWriteImps && p->vOneHots && Fra_OneHotCount(p, p->vOneHots) )
    {
        extern void Ioa_WriteAiger( Aig_Man_t * pMan, char * pFileName, int fWriteSymbols, int fCompact );
        Aig_Man_t * pNew;
        char * pFileName = Ioa_FileNameGenericAppend( p->pManAig->pName, "_care.aig" );
        printf( "Care one-hotness clauses will be written into file \"%s\".\n", pFileName );
        pManAigNew = Aig_ManDupOrdered( pManAig );
        pNew = Fra_OneHotCreateExdc( p, p->vOneHots );
        Ioa_WriteAiger( pNew, pFileName, 0, 1 );
        Aig_ManStop( pNew );
    }
    else 
    {
    //    Fra_ClassesPrint( p->pCla, 1 );
        Fra_ClassesSelectRepr( p->pCla );
        Fra_ClassesCopyReprs( p->pCla, p->vTimeouts );
        pManAigNew = Aig_ManDupRepr( pManAig, 0 );
    }
    // add implications to the manager
//    if ( fWriteImps && p->pCla->vImps && Vec_IntSize(p->pCla->vImps) )
//        Fra_ImpRecordInManager( p, pManAigNew );
    // cleanup the new manager
    Aig_ManSeqCleanup( pManAigNew );
    // remove pointers to the dead nodes
//    Aig_ManForEachObj( pManAig, pObj, i )
//        if ( pObj->pData && Aig_ObjIsNone(pObj->pData) )
//            pObj->pData = NULL;
//    Aig_ManCountMergeRegs( pManAigNew );
p->timeTrav += Abc_Clock() - clk2;
p->timeTotal = Abc_Clock() - clk;
    // get the final stats
    p->nLitsEnd  = Fra_ClassesCountLits( p->pCla );
    p->nNodesEnd = Aig_ManNodeNum(pManAigNew);
    p->nRegsEnd  = Aig_ManRegNum(pManAigNew);
    // free the manager
finish:
    Fra_ManStop( p );
    // check the output
//    if ( Aig_ManCoNum(pManAigNew) - Aig_ManRegNum(pManAigNew) == 1 )
//        if ( Aig_ObjChild0( Aig_ManCo(pManAigNew,0) ) == Aig_ManConst0(pManAigNew) )
//            printf( "Proved output constant 0.\n" );
    pParams->nIters = nIter;
    return pManAigNew;
}